

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_function_list.cpp
# Opt level: O0

uint __thiscall
ON_FunctionList::IsInList
          (ON_FunctionList *this,_func_void_ON__UINT_PTR *function,ON__UINT_PTR function_parameter)

{
  bool bVar1;
  tagFunctionItem *ptVar2;
  tagFunctionItem *item;
  int rc;
  ON__UINT_PTR function_parameter_local;
  _func_void_ON__UINT_PTR *function_local;
  ON_FunctionList *this_local;
  
  if (function == (_func_void_ON__UINT_PTR *)0x0) {
    this_local._4_4_ = 2;
  }
  else {
    bVar1 = ON_Lock::GetDefaultLock(&this->m_lock);
    if (bVar1) {
      item._4_4_ = 2;
      ptVar2 = FindItem((tagFunctionItem *)this->m_head,function);
      if ((ptVar2 != (tagFunctionItem *)0x0) && (ptVar2->m_function_parameter == function_parameter)
         ) {
        item._4_4_ = 1;
      }
      ON_Lock::ReturnDefaultLock(&this->m_lock);
      this_local._4_4_ = item._4_4_;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

unsigned int ON_FunctionList::IsInList(
    void (*function)(ON__UINT_PTR),
    ON__UINT_PTR function_parameter
    ) const
{
  if ( 0 == function)
    return 2;

  if ( false == m_lock.GetDefaultLock() )
    return 0;

  int rc = 2;
  struct tagFunctionItem* item = FindItem((struct tagFunctionItem*)m_head,function);
  if ( item && item->m_function_parameter == function_parameter )
  {
    rc = 1;
  }

  m_lock.ReturnDefaultLock();

  return rc;
}